

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  string_view sVar1;
  string_view sVar2;
  FieldDescriptor *info_tree;
  undefined8 uVar3;
  bool bVar4;
  CppType CVar5;
  int iVar6;
  Reflection *this_00;
  Token *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *this_01;
  DescriptorStringView psVar8;
  LogMessage *pLVar9;
  FieldOptions *pFVar10;
  AlphaNum *e;
  undefined4 extraout_var_02;
  MessageLite *this_02;
  ParseLocation in_R8;
  string_view sVar11;
  ParseLocationRange location;
  char (*in_stack_ffffffffffffefb8) [3];
  ParseInfoTree *this_03;
  bool local_fbb;
  MessageFactory *local_fa8;
  byte local_f22;
  byte local_f01;
  FieldDescriptor *local_e80;
  FieldDescriptor *local_e50;
  Descriptor *local_dd0;
  bool local_d79;
  ParseLocation local_d64;
  ParseLocation local_d5c;
  ParseLocationRange local_d54;
  int local_d44;
  int local_d40;
  int end_column;
  int end_line;
  allocator<char> local_d11;
  string local_d10;
  allocator<char> local_ce9;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  allocator<char> local_c99;
  string local_c98;
  byte local_c73;
  byte local_c72;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  string_view local_c28;
  MessageFactory *local_c18;
  MessageFactory *factory;
  string tmp;
  string local_be8;
  byte local_bc1;
  undefined1 local_bc0 [7];
  bool consumed_semicolon;
  AlphaNum local_b90;
  AlphaNum local_b60;
  AlphaNum local_b30;
  AlphaNum local_b00;
  string local_ad0;
  string_view local_ab0;
  FieldDescriptor *local_aa0;
  FieldDescriptor *other_field;
  OneofDescriptor *oneof;
  AlphaNum local_a60;
  AlphaNum local_a30;
  undefined1 local_a00 [40];
  char *local_9d8;
  AlphaNum local_9d0;
  AlphaNum local_9a0;
  AlphaNum local_970;
  undefined1 local_940 [40];
  char *local_918;
  byte local_90b;
  byte local_90a;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  byte local_891;
  basic_string_view<char,_std::char_traits<char>_> local_890;
  LogMessageFatal local_880 [23];
  Voidify local_869;
  AlphaNum local_868;
  AlphaNum local_838;
  AlphaNum local_808;
  AlphaNum local_7d8;
  AlphaNum local_7a8;
  string local_778;
  string_view local_758;
  AlphaNum local_748;
  AlphaNum local_718;
  AlphaNum local_6e8;
  AlphaNum local_6b8;
  AlphaNum local_688;
  string local_658;
  string_view local_638;
  string_view local_628;
  string_view local_618;
  string local_608 [8];
  string lower_field_name_1;
  string local_5d8 [8];
  string lower_field_name;
  uint local_594;
  undefined1 local_590 [4];
  int32_t field_number;
  AlphaNum local_560;
  AlphaNum local_530;
  AlphaNum local_500;
  AlphaNum local_4d0;
  string local_4a0;
  string_view local_480;
  AlphaNum local_470;
  AlphaNum local_440;
  AlphaNum local_410;
  AlphaNum local_3e0;
  AlphaNum local_3b0;
  string local_380;
  string_view local_360;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  string local_2e0;
  string_view local_2c0;
  AlphaNum local_2b0;
  AlphaNum local_280;
  AlphaNum local_250;
  undefined1 local_220 [40];
  char *local_1f8;
  Descriptor *local_1f0;
  Descriptor *value_descriptor;
  string serialized_value;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  AlphaNum local_178;
  AlphaNum local_148;
  undefined1 local_118 [8];
  string prefix_and_full_type_name;
  undefined1 local_f0 [8];
  string prefix;
  string full_type_name;
  string local_a8;
  FieldDescriptor *local_78;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  undefined1 local_50 [7];
  bool reserved_field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *message_local;
  ParserImpl *this_local;
  
  this_00 = Message::GetReflection(message);
  field_name.field_2._8_8_ = Message::GetDescriptor(message);
  std::__cxx11::string::string((string *)local_50);
  field._7_1_ = 0;
  _start_column = (FieldDescriptor *)0x0;
  pTVar7 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._4_4_ = pTVar7->line;
  pTVar7 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._0_4_ = pTVar7->column;
  full_type_name.field_2._M_local_buf[0xe] = '\0';
  full_type_name.field_2._M_local_buf[0xd] = '\0';
  bVar4 = internal::GetAnyFieldDescriptors(message,&any_value_field,&local_78);
  local_d79 = false;
  if (bVar4) {
    std::allocator<char>::allocator();
    full_type_name.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"[",
               (allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf));
    full_type_name.field_2._M_local_buf[0xd] = '\x01';
    local_d79 = TryConsume(this,&local_a8);
  }
  if ((full_type_name.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((full_type_name.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf))
    ;
  }
  if (local_d79 != false) {
    std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_f0);
    bVar4 = ConsumeAnyTypeUrl(this,(string *)(prefix.field_2._M_local_buf + 8),(string *)local_f0);
    if (bVar4) {
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prefix.field_2 + 8));
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,&local_148);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"]",&local_199);
      bVar4 = ConsumeBeforeWhitespace(this,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      if (bVar4) {
        TryConsumeWhitespace(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,":",
                   (allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        bVar4 = TryConsumeBeforeWhitespace(this,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        if (bVar4) {
          TryConsumeWhitespace(this);
        }
        std::__cxx11::string::string((string *)&value_descriptor);
        if (this->finder_ == (Finder *)0x0) {
          local_dd0 = anon_unknown_1::DefaultFinderFindAnyType
                                (message,(string *)local_f0,(string *)((long)&prefix.field_2 + 8));
        }
        else {
          iVar6 = (*this->finder_->_vptr_Finder[4])
                            (this->finder_,message,local_f0,
                             (undefined1 *)((long)&prefix.field_2 + 8));
          local_dd0 = (Descriptor *)CONCAT44(extraout_var,iVar6);
        }
        local_1f0 = local_dd0;
        if (local_dd0 == (Descriptor *)0x0) {
          absl::lts_20240722::AlphaNum::AlphaNum(&local_250,"Could not find type \"");
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
          ;
          absl::lts_20240722::AlphaNum::AlphaNum(&local_2b0,"\" stored in google.protobuf.Any.");
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_220,&local_250,&local_280);
          join_0x00000010_0x00000000_ =
               (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_220);
          ReportError(this,join_0x00000010_0x00000000_);
          std::__cxx11::string::~string((string *)local_220);
          this_local._7_1_ = 0;
        }
        else {
          bVar4 = ConsumeAnyValue(this,local_dd0,(string *)&value_descriptor);
          if (bVar4) {
            if ((this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) ||
               (((bVar4 = FieldDescriptor::is_repeated(any_value_field), bVar4 ||
                 (bVar4 = Reflection::HasField(this_00,message,any_value_field), !bVar4)) &&
                ((bVar4 = FieldDescriptor::is_repeated(local_78), bVar4 ||
                 (bVar4 = Reflection::HasField(this_00,message,local_78), !bVar4)))))) {
              std::__cxx11::string::string((string *)&local_2e0,(string *)local_118);
              Reflection::SetString(this_00,message,any_value_field,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::__cxx11::string::string((string *)&local_300,(string *)&value_descriptor);
              Reflection::SetString(this_00,message,local_78,&local_300);
              std::__cxx11::string::~string((string *)&local_300);
              this_local._7_1_ = 1;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_2c0,"Non-repeated Any specified multiple times.");
              ReportError(this,local_2c0);
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        prefix_and_full_type_name.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)&value_descriptor);
      }
      else {
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_118);
    }
    else {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
    goto LAB_0056b375;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"[",&local_321);
  bVar4 = TryConsume(this,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  if (bVar4) {
    bVar4 = ConsumeFullTypeName(this,(string *)local_50);
    if (!bVar4) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_0056b375;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"]",&local_349);
    bVar4 = ConsumeBeforeWhitespace(this,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    if (!bVar4) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_0056b375;
    }
    TryConsumeWhitespace(this);
    if (this->finder_ == (Finder *)0x0) {
      local_e50 = anon_unknown_1::DefaultFinderFindExtension(message,(string *)local_50);
    }
    else {
      iVar6 = (*this->finder_->_vptr_Finder[2])(this->finder_,message,local_50);
      local_e50 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar6);
    }
    _start_column = local_e50;
    if (local_e50 == (FieldDescriptor *)0x0) {
      if (((this->allow_unknown_field_ & 1U) == 0) && ((this->allow_unknown_extension_ & 1U) == 0))
      {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_3b0,"Extension \"");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20240722::AlphaNum::AlphaNum
                  (&local_410,"\" is not defined or is not an extension of \"");
        psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_440,psVar8);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_470,"\".");
        absl::lts_20240722::StrCat<>
                  (&local_380,&local_3b0,&local_3e0,&local_410,&local_440,&local_470);
        local_360 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_380);
        ReportError(this,local_360);
        std::__cxx11::string::~string((string *)&local_380);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
      absl::lts_20240722::AlphaNum::AlphaNum(&local_4d0,"Ignoring extension \"");
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_500,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20240722::AlphaNum::AlphaNum
                (&local_530,"\" which is not defined or is not an extension of \"");
      psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_560,psVar8);
      absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)local_590,"\".");
      in_R8 = (ParseLocation)&local_560;
      absl::lts_20240722::StrCat<>
                (&local_4a0,&local_4d0,&local_500,&local_530,(AlphaNum *)in_R8,(AlphaNum *)local_590
                );
      local_480 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4a0);
      ReportWarning(this,local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
    }
  }
  else {
    bVar4 = ConsumeIdentifierBeforeWhitespace(this,(string *)local_50);
    if (!bVar4) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_0056b375;
    }
    TryConsumeWhitespace(this);
    if ((this->allow_field_number_ & 1U) == 0) {
LAB_00569c5a:
      uVar3 = field_name.field_2._8_8_;
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      lower_field_name.field_2._8_8_ = sVar11._M_len;
      _start_column = Descriptor::FindFieldByName((Descriptor *)uVar3,sVar11);
      if (_start_column == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string(local_5d8,(string *)local_50);
        absl::lts_20240722::AsciiStrToLower(local_5d8);
        uVar3 = field_name.field_2._8_8_;
        sVar11 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_5d8);
        lower_field_name_1.field_2._8_8_ = sVar11._M_len;
        _start_column = Descriptor::FindFieldByName((Descriptor *)uVar3,sVar11);
        if ((_start_column != (FieldDescriptor *)0x0) &&
           (bVar4 = internal::cpp::IsGroupLike(_start_column), !bVar4)) {
          _start_column = (FieldDescriptor *)0x0;
        }
        if (_start_column != (FieldDescriptor *)0x0) {
          this_01 = FieldDescriptor::message_type(_start_column);
          psVar8 = Descriptor::name_abi_cxx11_(this_01);
          bVar4 = std::operator!=(psVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_50);
          if (bVar4) {
            _start_column = (FieldDescriptor *)0x0;
          }
        }
        std::__cxx11::string::~string(local_5d8);
      }
      sVar11._M_str = local_618._M_str;
      sVar11._M_len = local_618._M_len;
      if ((_start_column == (FieldDescriptor *)0x0) &&
         (local_618 = sVar11, (this->allow_case_insensitive_field_ & 1U) != 0)) {
        std::__cxx11::string::string(local_608,(string *)local_50);
        absl::lts_20240722::AsciiStrToLower(local_608);
        uVar3 = field_name.field_2._8_8_;
        local_618 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_608)
        ;
        _start_column = Descriptor::FindFieldByLowercaseName((Descriptor *)uVar3,local_618);
        std::__cxx11::string::~string(local_608);
      }
      uVar3 = field_name.field_2._8_8_;
      if (_start_column == (FieldDescriptor *)0x0) {
        local_628 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        field._7_1_ = Descriptor::IsReservedName((Descriptor *)uVar3,local_628);
      }
    }
    else {
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      bVar4 = absl::lts_20240722::SimpleAtoi<int>(sVar11,(Nonnull<int_*>)&local_594);
      if (!bVar4) goto LAB_00569c5a;
      bVar4 = Descriptor::IsExtensionNumber((Descriptor *)field_name.field_2._8_8_,local_594);
      if (bVar4) {
        if (this->finder_ == (Finder *)0x0) {
          local_e80 = anon_unknown_1::DefaultFinderFindExtensionByNumber
                                ((Descriptor *)field_name.field_2._8_8_,local_594);
        }
        else {
          iVar6 = (*this->finder_->_vptr_Finder[3])
                            (this->finder_,field_name.field_2._8_8_,(ulong)local_594);
          local_e80 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar6);
        }
        _start_column = local_e80;
      }
      else {
        bVar4 = Descriptor::IsReservedNumber((Descriptor *)field_name.field_2._8_8_,local_594);
        if (bVar4) {
          field._7_1_ = 1;
        }
        else {
          _start_column =
               Descriptor::FindFieldByNumber((Descriptor *)field_name.field_2._8_8_,local_594);
        }
      }
    }
    sVar2._M_str = local_758._M_str;
    sVar2._M_len = local_758._M_len;
    sVar1._M_str = local_480._M_str;
    sVar1._M_len = local_480._M_len;
    if ((_start_column == (FieldDescriptor *)0x0) &&
       (local_480 = sVar1, local_758 = sVar2, (field._7_1_ & 1) == 0)) {
      if ((this->allow_unknown_field_ & 1U) == 0) {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_688,"Message type \"");
        psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_6b8,psVar8);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_6e8,"\" has no field named \"");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_718,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_748,"\".");
        absl::lts_20240722::StrCat<>
                  (&local_658,&local_688,&local_6b8,&local_6e8,&local_718,&local_748);
        local_638 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_658);
        ReportError(this,local_638);
        std::__cxx11::string::~string((string *)&local_658);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
      absl::lts_20240722::AlphaNum::AlphaNum(&local_7a8,"Message type \"");
      psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_7d8,psVar8);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_808,"\" has no field named \"");
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_838,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_868,"\".");
      in_R8 = (ParseLocation)&local_838;
      absl::lts_20240722::StrCat<>
                (&local_778,&local_7a8,&local_7d8,&local_808,(AlphaNum *)in_R8,&local_868);
      local_758 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_778);
      ReportWarning(this,local_758);
      std::__cxx11::string::~string((string *)&local_778);
    }
  }
  if (_start_column == (FieldDescriptor *)0x0) {
    local_891 = 0;
    local_f01 = 1;
    if (((this->allow_unknown_field_ & 1U) == 0) &&
       (local_f01 = 1, (this->allow_unknown_extension_ & 1U) == 0)) {
      local_f01 = field._7_1_;
    }
    if (((local_f01 ^ 0xff) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_890,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                 ,0x281,local_890._M_len,local_890._M_str);
      local_891 = 1;
      pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_880)
      ;
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_869,pLVar9);
    }
    if ((local_891 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_880);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,":",&local_8b9);
    bVar4 = TryConsumeBeforeWhitespace(this,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
    if (bVar4) {
      TryConsumeWhitespace(this);
      std::allocator<char>::allocator();
      local_90a = 0;
      local_90b = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"{",&local_8e1);
      bVar4 = LookingAt(this,&local_8e0);
      local_f22 = 0;
      if (!bVar4) {
        std::allocator<char>::allocator();
        local_90a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"<",&local_909);
        local_90b = 1;
        bVar4 = LookingAt(this,&local_908);
        local_f22 = bVar4 ^ 0xff;
      }
      if ((local_90b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_908);
      }
      if ((local_90a & 1) != 0) {
        std::allocator<char>::~allocator(&local_909);
      }
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      if ((local_f22 & 1) != 0) {
        this_local._7_1_ = SkipFieldValue(this);
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
    }
    this_local._7_1_ = SkipFieldMessage(this);
    prefix_and_full_type_name.field_2._12_4_ = 1;
    goto LAB_0056b375;
  }
  pFVar10 = FieldDescriptor::options(_start_column);
  bVar4 = FieldOptions::deprecated(pFVar10);
  if (bVar4) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_970,"text format contains deprecated field \"");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_9a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_9d0,"\"");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_940,&local_970,&local_9a0);
    join_0x00000010_0x00000000_ =
         (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_940);
    ReportWarning(this,join_0x00000010_0x00000000_);
    std::__cxx11::string::~string((string *)local_940);
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    bVar4 = FieldDescriptor::is_repeated(_start_column);
    if (!bVar4) {
      bVar4 = Reflection::HasField(this_00,message,_start_column);
      if (bVar4) {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_a30,"Non-repeated field \"");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_a60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)&oneof,"\" is specified multiple times.")
        ;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a00,&local_a30,&local_a60);
        join_0x00000010_0x00000000_ =
             (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a00);
        ReportError(this,join_0x00000010_0x00000000_);
        std::__cxx11::string::~string((string *)local_a00);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
    }
    other_field = (FieldDescriptor *)FieldDescriptor::containing_oneof(_start_column);
    if (other_field != (FieldDescriptor *)0x0) {
      bVar4 = Reflection::HasOneof(this_00,message,(OneofDescriptor *)other_field);
      if (bVar4) {
        local_aa0 = Reflection::GetOneofFieldDescriptor
                              (this_00,message,(OneofDescriptor *)other_field);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_b00,"Field \"");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_b30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_b60,"\" is specified along with field \"");
        psVar8 = FieldDescriptor::name_abi_cxx11_(local_aa0);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_b90,psVar8);
        absl::lts_20240722::AlphaNum::AlphaNum
                  ((AlphaNum *)local_bc0,"\", another member of oneof \"");
        e = (AlphaNum *)OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)other_field);
        absl::lts_20240722::StrCat<std::__cxx11::string,char[3]>
                  (&local_ad0,(lts_20240722 *)&local_b00,&local_b30,&local_b60,&local_b90,
                   (AlphaNum *)local_bc0,e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64b52b,
                   in_stack_ffffffffffffefb8);
        local_ab0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_ad0);
        ReportError(this,local_ab0);
        std::__cxx11::string::~string((string *)&local_ad0);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
    }
  }
  CVar5 = FieldDescriptor::cpp_type(_start_column);
  if (CVar5 == CPPTYPE_MESSAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be8,":",(allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
    bVar4 = TryConsumeBeforeWhitespace(this,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator((allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
    local_bc1 = bVar4;
    if (bVar4) {
      TryConsumeWhitespace(this);
    }
    if ((local_bc1 & 1) == 0) goto LAB_0056ac46;
    pFVar10 = FieldDescriptor::options(_start_column);
    bVar4 = FieldOptions::weak(pFVar10);
    if (!bVar4) goto LAB_0056ac46;
    bVar4 = LookingAtType(this,TYPE_STRING);
    if (!bVar4) goto LAB_0056ac46;
    std::__cxx11::string::string((string *)&factory);
    bVar4 = ConsumeString(this,(string *)&factory);
    if (bVar4) {
      if (this->finder_ == (Finder *)0x0) {
        local_fa8 = (MessageFactory *)0x0;
      }
      else {
        iVar6 = (*this->finder_->_vptr_Finder[5])(this->finder_,_start_column);
        local_fa8 = (MessageFactory *)CONCAT44(extraout_var_02,iVar6);
      }
      local_c18 = local_fa8;
      this_02 = &Reflection::MutableMessage(this_00,message,_start_column,local_fa8)->
                 super_MessageLite;
      local_c28 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&factory);
      MessageLite::ParseFromString(this_02,local_c28);
      prefix_and_full_type_name.field_2._12_4_ = 2;
    }
    else {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&factory);
    if (prefix_and_full_type_name.field_2._12_4_ != 2) goto LAB_0056b375;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,":",&local_c49);
    bVar4 = ConsumeBeforeWhitespace(this,&local_c48);
    std::__cxx11::string::~string((string *)&local_c48);
    std::allocator<char>::~allocator(&local_c49);
    if (!bVar4) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_0056b375;
    }
    TryConsumeWhitespace(this);
LAB_0056ac46:
    local_c72 = 0;
    local_c73 = 0;
    bVar4 = FieldDescriptor::is_repeated(_start_column);
    local_fbb = false;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_c72 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"[",&local_c71);
      local_c73 = 1;
      local_fbb = TryConsume(this,&local_c70);
    }
    if ((local_c73 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c70);
    }
    if ((local_c72 & 1) != 0) {
      std::allocator<char>::~allocator(&local_c71);
    }
    if (local_fbb == false) {
      CVar5 = FieldDescriptor::cpp_type(_start_column);
      if (CVar5 == CPPTYPE_MESSAGE) {
        bVar4 = ConsumeFieldMessage(this,message,this_00,_start_column);
        if (!bVar4) {
          this_local._7_1_ = 0;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_0056b375;
        }
      }
      else {
        bVar4 = ConsumeFieldValue(this,message,this_00,_start_column);
        if (!bVar4) {
          this_local._7_1_ = 0;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_0056b375;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"]",&local_c99);
      bVar4 = TryConsume(this,&local_c98);
      std::__cxx11::string::~string((string *)&local_c98);
      std::allocator<char>::~allocator(&local_c99);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        do {
          CVar5 = FieldDescriptor::cpp_type(_start_column);
          if (CVar5 == CPPTYPE_MESSAGE) {
            bVar4 = ConsumeFieldMessage(this,message,this_00,_start_column);
            if (!bVar4) {
              this_local._7_1_ = 0;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_0056b375;
            }
          }
          else {
            bVar4 = ConsumeFieldValue(this,message,this_00,_start_column);
            if (!bVar4) {
              this_local._7_1_ = 0;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_0056b375;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"]",&local_cc1);
          bVar4 = TryConsume(this,&local_cc0);
          std::__cxx11::string::~string((string *)&local_cc0);
          std::allocator<char>::~allocator(&local_cc1);
          if (bVar4) goto LAB_0056b0f4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,",",&local_ce9);
          bVar4 = Consume(this,&local_ce8);
          std::__cxx11::string::~string((string *)&local_ce8);
          std::allocator<char>::~allocator(&local_ce9);
        } while (bVar4);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_0056b375;
      }
    }
  }
LAB_0056b0f4:
  std::allocator<char>::allocator();
  end_column._2_1_ = 0;
  end_column._1_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d10,";",&local_d11);
  bVar4 = TryConsume(this,&local_d10);
  if (!bVar4) {
    std::allocator<char>::allocator();
    end_column._2_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&end_line,",",(allocator<char> *)((long)&end_column + 3));
    end_column._1_1_ = 1;
    TryConsume(this,(string *)&end_line);
  }
  if ((end_column._1_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&end_line);
  }
  if ((end_column._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&end_column + 3));
  }
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator(&local_d11);
  if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
    pTVar7 = io::Tokenizer::previous(&this->tokenizer_);
    local_d40 = pTVar7->line;
    pTVar7 = io::Tokenizer::previous(&this->tokenizer_);
    info_tree = _start_column;
    local_d44 = pTVar7->end_column;
    this_03 = this->parse_info_tree_;
    ParseLocation::ParseLocation
              (&local_d5c,any_type_url_field._4_4_,(ColumnNumber)any_type_url_field);
    ParseLocation::ParseLocation(&local_d64,local_d40,local_d44);
    ParseLocationRange::ParseLocationRange(&local_d54,local_d5c,local_d64);
    location.end = in_R8;
    location.start = local_d54.end;
    RecordLocation((TextFormat *)this_03,(ParseInfoTree *)info_tree,
                   (FieldDescriptor *)local_d54.start,location);
  }
  this_local._7_1_ = 1;
  prefix_and_full_type_name.field_2._12_4_ = 1;
LAB_0056b375:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }